

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseDriveFormal(Ver_Man_t *pMan,Abc_Ntk_t *pNtk,Ver_Bundle_t *pBundle0)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *local_150;
  uint local_13c;
  int local_138;
  int m;
  int j;
  int k;
  Abc_Obj_t *pNetFormal;
  Abc_Obj_t *pNetAct;
  Abc_Obj_t *pTermNew;
  Abc_Obj_t *pTerm;
  Abc_Obj_t *pBox;
  Ver_Bundle_t *pBundle;
  char *pName;
  char Buffer [200];
  Ver_Bundle_t *pBundle0_local;
  Abc_Ntk_t *pNtk_local;
  Ver_Man_t *pMan_local;
  
  pBox = (Abc_Obj_t *)0x0;
  for (local_13c = 0; iVar1 = Vec_PtrSize(pBundle0->vNetsActual), (int)local_13c < iVar1;
      local_13c = local_13c + 1) {
    Vec_PtrEntry(pBundle0->vNetsActual,local_13c);
    iVar1 = Vec_PtrSize(pBundle0->vNetsActual);
    if (iVar1 == 1) {
      sprintf((char *)&pName,"%s",pBundle0->pNameFormal);
    }
    else {
      sprintf((char *)&pName,"%s[%d]",pBundle0->pNameFormal,(ulong)local_13c);
    }
    pAVar3 = Abc_NtkFindNet(pNtk,(char *)&pName);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      __assert_fail("Abc_NtkFindNet( pNtk, Buffer ) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0xa00,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
    }
    pAVar3 = Abc_NtkFindOrCreateNet(pNtk,(char *)&pName);
    pAVar4 = Abc_NtkCreateBo(pNtk);
    iVar1 = Abc_NtkBoxNum(pNtk);
    if (1 < iVar1) {
      __assert_fail("Abc_NtkBoxNum(pNtk) <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                    ,0xa04,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
    }
    iVar1 = Abc_NtkBoxNum(pNtk);
    if (iVar1 == 0) {
      local_150 = Abc_NtkCreateBlackbox(pNtk);
    }
    else {
      local_150 = Abc_NtkBox(pNtk,0);
    }
    pAVar5 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar5,pAVar3);
    Abc_ObjAddFanin(pAVar3,pAVar4);
    Abc_ObjAddFanin(pAVar4,local_150);
  }
  pcVar2 = Extra_UtilStrsav(pBundle0->pNameFormal);
  m = 0;
  do {
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtk->pData);
    if (iVar1 <= m) {
      if (pcVar2 != (char *)0x0) {
        free(pcVar2);
      }
      return 1;
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pNtk->pData,m);
    local_138 = Vec_PtrSize((Vec_Ptr_t *)(pAVar3->field_6).pCopy);
    do {
      local_138 = local_138 + -1;
      if (local_138 < 0) break;
      pBox = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)(pAVar3->field_6).pCopy,local_138);
    } while ((pBox == (Abc_Obj_t *)0x0) || (iVar1 = strcmp((char *)pBox->pNtk,pcVar2), iVar1 != 0));
    iVar1 = Vec_PtrSize((Vec_Ptr_t *)(pAVar3->field_6).pCopy);
    if (local_138 != iVar1) {
      if (pBox == (Abc_Obj_t *)0x0) {
        __assert_fail("pBundle",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0xa17,"int Ver_ParseDriveFormal(Ver_Man_t *, Abc_Ntk_t *, Ver_Bundle_t *)");
      }
      for (local_13c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pBox->pNext), (int)local_13c < iVar1;
          local_13c = local_13c + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pBox->pNext,local_13c);
        iVar1 = Abc_ObjFaninNum(pAVar4);
        if (0 < iVar1) {
          pcVar2 = Abc_NtkName(pNtk);
          sprintf(pMan->sError,"Missing specification of the I/Os of undefined box \"%s\".",pcVar2);
          Ver_ParsePrintErrorMessage(pMan);
          return 0;
        }
      }
      local_13c = Vec_PtrSize((Vec_Ptr_t *)pBox->pNext);
      while (local_13c = local_13c + -1, -1 < (int)local_13c) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pBox->pNext,local_13c);
        pAVar5 = Abc_NtkCreateBo(pAVar4->pNtk);
        Abc_ObjAddFanin(pAVar5,pAVar3);
        Abc_ObjAddFanin(pAVar4,pAVar5);
      }
      Ver_ParseFreeBundle((Ver_Bundle_t *)pBox);
      pBox = (Abc_Obj_t *)0x0;
      Vec_PtrWriteEntry((Vec_Ptr_t *)(pAVar3->field_6).pCopy,local_138,(void *)0x0);
    }
    m = m + 1;
  } while( true );
}

Assistant:

int Ver_ParseDriveFormal( Ver_Man_t * pMan, Abc_Ntk_t * pNtk, Ver_Bundle_t * pBundle0 )
{
    char Buffer[200];
    char * pName;
    Ver_Bundle_t * pBundle = NULL;
    Abc_Obj_t * pBox, * pTerm, * pTermNew, * pNetAct, * pNetFormal;
    int k, j, m;

    // drive this net in the undef box
    Vec_PtrForEachEntry( Abc_Obj_t *, pBundle0->vNetsActual, pNetAct, m )
    {
        // create the formal net
        if ( Vec_PtrSize(pBundle0->vNetsActual) == 1 )
            sprintf( Buffer, "%s", pBundle0->pNameFormal );
        else
            sprintf( Buffer, "%s[%d]", pBundle0->pNameFormal, m );
        assert( Abc_NtkFindNet( pNtk, Buffer ) == NULL );
        pNetFormal = Abc_NtkFindOrCreateNet( pNtk, Buffer );
        // connect it to the box
        pTerm = Abc_NtkCreateBo( pNtk );
        assert( Abc_NtkBoxNum(pNtk) <= 1 );
        pBox = Abc_NtkBoxNum(pNtk)? Abc_NtkBox(pNtk,0) : Abc_NtkCreateBlackbox(pNtk);
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtk), pNetFormal );
        Abc_ObjAddFanin( pNetFormal, pTerm );
        Abc_ObjAddFanin( pTerm, pBox );
    }

    // go through instances of this type
    pName = Extra_UtilStrsav(pBundle0->pNameFormal);
    Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
    {
        // find a bundle with the given name in this instance
        Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
            if ( pBundle && !strcmp( pBundle->pNameFormal, pName ) )
                break;
        // skip non-driven bundles
        if ( j == Vec_PtrSize((Vec_Ptr_t *)pBox->pCopy) )
            continue;
        // check if any nets are driven in this bundle
        assert(pBundle); // Verify pBundle was assigned to.
        Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
            if ( Abc_ObjFaninNum(pNetAct) > 0 )
            {
                sprintf( pMan->sError, "Missing specification of the I/Os of undefined box \"%s\".", Abc_NtkName(pNtk) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
        // drive the nets by the undef box
        Vec_PtrForEachEntryReverse( Abc_Obj_t *, pBundle->vNetsActual, pNetAct, m )
        {
            pTermNew = Abc_NtkCreateBo( pNetAct->pNtk );
            Abc_ObjAddFanin( pTermNew, pBox );
            Abc_ObjAddFanin( pNetAct, pTermNew );
        }
        // remove the bundle
        Ver_ParseFreeBundle( pBundle ); pBundle = NULL;
        Vec_PtrWriteEntry( (Vec_Ptr_t *)pBox->pCopy, j, NULL );
    }
    ABC_FREE( pName );
    return 1;
}